

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_ssse3_intr.c
# Opt level: O1

void ihevc_intra_pred_luma_dc_ssse3
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  ulong uVar1;
  UWORD8 aUVar2 [16];
  uint uVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  UWORD8 *pUVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  short sVar12;
  undefined8 uVar13;
  short sVar14;
  undefined1 in_XMM1 [16];
  ushort uVar15;
  undefined4 uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  undefined1 in_XMM3 [16];
  undefined1 auVar25 [16];
  ushort uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  
  uVar3 = nt << 0x1e | nt - 4U >> 2;
  bVar5 = 6;
  if (uVar3 < 4) {
    bVar5 = (byte)*(undefined4 *)(&DAT_001722a0 + (ulong)uVar3 * 4);
  }
  uVar3 = nt * 2;
  lVar4 = (long)nt;
  uVar1 = lVar4 * 3;
  if (nt == 4) {
    auVar11 = pmovzxbw(in_XMM1,*(undefined8 *)(pu1_ref + 4));
    auVar11 = phaddw(auVar11,(undefined1  [16])0x0);
    auVar11 = phaddw(auVar11,(undefined1  [16])0x0);
    auVar11 = phaddw(auVar11,(undefined1  [16])0x0);
    iVar6 = (int)((((uint)pu1_ref[uVar1 & 0xffffffff] + auVar11._0_4_) - (uint)pu1_ref[uVar3]) + 4)
            >> (bVar5 & 0x1f);
    auVar11 = pmovzxbw(auVar11,*(undefined8 *)(pu1_ref + (ulong)uVar3 + 1));
    uVar10 = iVar6 * 3 + 2;
    auVar25 = pshuflw(ZEXT416(uVar10),ZEXT416(uVar10),0);
    sVar12 = auVar25._0_2_;
    sVar14 = auVar25._2_2_;
    uVar15 = (ushort)(sVar12 + auVar11._0_2_) >> 2;
    uVar17 = (ushort)(sVar14 + auVar11._2_2_) >> 2;
    uVar18 = (ushort)(sVar12 + auVar11._4_2_) >> 2;
    uVar19 = (ushort)(sVar14 + auVar11._6_2_) >> 2;
    uVar20 = (ushort)(sVar12 + auVar11._8_2_) >> 2;
    uVar21 = (ushort)(sVar14 + auVar11._10_2_) >> 2;
    uVar22 = (ushort)(sVar12 + auVar11._12_2_) >> 2;
    uVar23 = (ushort)(sVar14 + auVar11._14_2_) >> 2;
    uVar16 = CONCAT13((uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19),
                      CONCAT12((uVar18 != 0) * (uVar18 < 0x100) * (char)uVar18 - (0xff < uVar18),
                               CONCAT11((uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 -
                                        (0xff < uVar17),
                                        (uVar15 != 0) * (uVar15 < 0x100) * (char)uVar15 -
                                        (0xff < uVar15))));
    *(undefined4 *)pu1_dst = uVar16;
    aUVar2 = IHEVCE_SHUFFLEMASK4;
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         CONCAT17((uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23),
                  CONCAT16((uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22),
                           CONCAT15((uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 -
                                    (0xff < uVar21),
                                    CONCAT14((uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 -
                                             (0xff < uVar20),uVar16)))) & 0xffffffffffff0000 |
         (ulong)(ushort)iVar6;
    auVar11 = pshufb(auVar11,(undefined1  [16])IHEVCE_SHUFFLEMASK4);
    lVar4 = (long)dst_strd;
    pUVar7 = pu1_dst + lVar4;
    *(int *)(pu1_dst + lVar4) = auVar11._0_4_;
    auVar11 = pshufb(auVar11,(undefined1  [16])aUVar2);
    *(int *)(pu1_dst + lVar4 * 2) = auVar11._0_4_;
    *(int *)(pu1_dst + lVar4 * 3) = auVar11._0_4_;
    *pu1_dst = (UWORD8)((uint)pu1_ref[uVar3 - 1] + iVar6 * 2 + (uint)pu1_ref[9] + 2 >> 2);
    lVar8 = 3;
    do {
      *pUVar7 = (UWORD8)(pu1_ref[lVar8 + (long)(int)(uVar3 - 2) + -3] + uVar10 >> 2);
      pUVar7 = pUVar7 + lVar4;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  else if (nt == 8) {
    auVar11 = psadbw(*(undefined1 (*) [16])(pu1_ref + 8),(undefined1  [16])0x0);
    auVar11 = pshufb(auVar11,(undefined1  [16])IHEVCE_SHUFFLEMASK5);
    auVar25 = phaddw(auVar11,(undefined1  [16])0x0);
    uVar9 = (int)((((uint)pu1_ref[uVar1 & 0xffffffff] + auVar25._0_4_) - (uint)pu1_ref[uVar3]) + 8)
            >> (bVar5 & 0x1f);
    uVar10 = uVar9 * 3 + 2;
    auVar11 = pshuflw(ZEXT416(uVar10),ZEXT416(uVar10),0);
    auVar25 = pmovzxbw(auVar25,*(undefined8 *)(pu1_ref + (ulong)uVar3 + 1));
    sVar12 = auVar11._0_2_;
    sVar14 = auVar11._2_2_;
    uVar15 = (ushort)(auVar25._0_2_ + sVar12) >> 2;
    uVar17 = (ushort)(auVar25._2_2_ + sVar14) >> 2;
    uVar18 = (ushort)(auVar25._4_2_ + sVar12) >> 2;
    uVar19 = (ushort)(auVar25._6_2_ + sVar14) >> 2;
    uVar20 = (ushort)(auVar25._8_2_ + sVar12) >> 2;
    uVar21 = (ushort)(auVar25._10_2_ + sVar14) >> 2;
    uVar22 = (ushort)(auVar25._12_2_ + sVar12) >> 2;
    uVar23 = (ushort)(auVar25._14_2_ + sVar14) >> 2;
    *(ulong *)pu1_dst =
         CONCAT17((uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23),
                  CONCAT16((uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22),
                           CONCAT15((uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 -
                                    (0xff < uVar21),
                                    CONCAT14((uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 -
                                             (0xff < uVar20),
                                             CONCAT13((uVar19 != 0) * (uVar19 < 0x100) *
                                                      (char)uVar19 - (0xff < uVar19),
                                                      CONCAT12((uVar18 != 0) * (uVar18 < 0x100) *
                                                               (char)uVar18 - (0xff < uVar18),
                                                               CONCAT11((uVar17 != 0) *
                                                                        (uVar17 < 0x100) *
                                                                        (char)uVar17 -
                                                                        (0xff < uVar17),
                                                                        (uVar15 != 0) *
                                                                        (uVar15 < 0x100) *
                                                                        (char)uVar15 -
                                                                        (0xff < uVar15))))))));
    auVar11 = pshufb(ZEXT416(uVar9),(undefined1  [16])0x0);
    lVar4 = (long)dst_strd;
    pUVar7 = pu1_dst + lVar4;
    uVar13 = auVar11._0_8_;
    *(undefined8 *)(pu1_dst + lVar4) = uVar13;
    *(undefined8 *)(pu1_dst + lVar4 * 2) = uVar13;
    *(undefined8 *)(pu1_dst + lVar4 * 3) = uVar13;
    *(undefined8 *)(pu1_dst + lVar4 * 4) = uVar13;
    *(undefined8 *)(pu1_dst + lVar4 * 5) = uVar13;
    *(undefined8 *)(pu1_dst + lVar4 * 6) = uVar13;
    *(undefined8 *)(pu1_dst + lVar4 * 7) = uVar13;
    *pu1_dst = (UWORD8)((uint)pu1_ref[uVar3 - 1] + uVar9 * 2 + (uint)pu1_ref[0x11] + 2 >> 2);
    lVar8 = 7;
    do {
      *pUVar7 = (UWORD8)(pu1_ref[lVar8 + (long)(int)(uVar3 - 2) + -7] + uVar10 >> 2);
      pUVar7 = pUVar7 + lVar4;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  else if (nt == 0x20) {
    auVar11 = psadbw(*(undefined1 (*) [16])(pu1_ref + 0x20),(undefined1  [16])0x0);
    auVar25 = psadbw(*(undefined1 (*) [16])(pu1_ref + 0x30),(undefined1  [16])0x0);
    auVar33 = psadbw(*(undefined1 (*) [16])(pu1_ref + 0x40),(undefined1  [16])0x0);
    auVar34 = psadbw(*(undefined1 (*) [16])(pu1_ref + 0x50),(undefined1  [16])0x0);
    auVar35._0_2_ = auVar34._0_2_ + auVar33._0_2_ + auVar25._0_2_ + auVar11._0_2_;
    auVar35._2_2_ = auVar34._2_2_ + auVar33._2_2_ + auVar25._2_2_ + auVar11._2_2_;
    auVar35._4_2_ = auVar34._4_2_ + auVar33._4_2_ + auVar25._4_2_ + auVar11._4_2_;
    auVar35._6_2_ = auVar34._6_2_ + auVar33._6_2_ + auVar25._6_2_ + auVar11._6_2_;
    auVar35._8_2_ = auVar34._8_2_ + auVar33._8_2_ + auVar25._8_2_ + auVar11._8_2_;
    auVar35._10_2_ = auVar34._10_2_ + auVar33._10_2_ + auVar25._10_2_ + auVar11._10_2_;
    auVar35._12_2_ = auVar34._12_2_ + auVar33._12_2_ + auVar25._12_2_ + auVar11._12_2_;
    auVar35._14_2_ = auVar34._14_2_ + auVar33._14_2_ + auVar25._14_2_ + auVar11._14_2_;
    auVar25 = pshufb(auVar35,(undefined1  [16])IHEVCE_SHUFFLEMASK5);
    auVar11 = phaddw(auVar25,auVar11);
    auVar11 = pshufb(ZEXT416((uint)((int)((((uint)pu1_ref[uVar1 & 0xffffffff] + auVar11._0_4_) -
                                          (uint)pu1_ref[uVar3]) + 0x20) >> (bVar5 & 0x1f))),
                     (undefined1  [16])0x0);
    iVar6 = 1;
    do {
      *(undefined1 (*) [16])pu1_dst = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 2) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 3) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 4) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 5) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 6) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 7) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 8) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 9) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 10) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 0xb) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 0xc) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 0xd) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 0xe) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 0xf) = auVar11;
      *(undefined1 (*) [16])((long)pu1_dst + 0x10) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 2) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 3) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 4) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 5) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 6) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 7) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 8) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 9) = auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 10) = auVar11
      ;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 0xb) =
           auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 0xc) =
           auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 0xd) =
           auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 0xe) =
           auVar11;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 0xf) =
           auVar11;
      pu1_dst = *(undefined1 (*) [16])pu1_dst + dst_strd * 0x10;
      iVar6 = iVar6 + -1;
    } while (iVar6 == 0);
  }
  else {
    auVar11 = psadbw(*(undefined1 (*) [16])(pu1_ref + lVar4),(undefined1  [16])0x0);
    auVar25 = psadbw(*(undefined1 (*) [16])(pu1_ref + lVar4 + 0x10),(undefined1  [16])0x0);
    auVar34._0_2_ = auVar25._0_2_ + auVar11._0_2_;
    auVar34._2_2_ = auVar25._2_2_ + auVar11._2_2_;
    auVar34._4_2_ = auVar25._4_2_ + auVar11._4_2_;
    auVar34._6_2_ = auVar25._6_2_ + auVar11._6_2_;
    auVar34._8_2_ = auVar25._8_2_ + auVar11._8_2_;
    auVar34._10_2_ = auVar25._10_2_ + auVar11._10_2_;
    auVar34._12_2_ = auVar25._12_2_ + auVar11._12_2_;
    auVar34._14_2_ = auVar25._14_2_ + auVar11._14_2_;
    auVar25 = pmovzxbw(auVar11,*(undefined8 *)(pu1_ref + (long)(int)uVar3 + 1));
    auVar33 = pmovzxbw(in_XMM3,*(undefined8 *)(pu1_ref + (long)(int)uVar3 + 9));
    auVar11 = pshufb(auVar34,(undefined1  [16])IHEVCE_SHUFFLEMASK5);
    auVar11 = phaddw(auVar11,(undefined1  [16])0x0);
    uVar10 = (int)(((uint)pu1_ref[uVar1] + nt + auVar11._0_4_) - (uint)pu1_ref[(int)uVar3]) >>
             (bVar5 & 0x1f);
    auVar11 = ZEXT416(uVar10 * 3 + 2);
    auVar11 = pshuflw(auVar11,auVar11,0);
    sVar12 = auVar11._0_2_;
    sVar14 = auVar11._2_2_;
    uVar15 = (ushort)(auVar25._0_2_ + sVar12) >> 2;
    uVar17 = (ushort)(auVar25._2_2_ + sVar14) >> 2;
    uVar18 = (ushort)(auVar25._4_2_ + sVar12) >> 2;
    uVar19 = (ushort)(auVar25._6_2_ + sVar14) >> 2;
    uVar20 = (ushort)(auVar25._8_2_ + sVar12) >> 2;
    uVar21 = (ushort)(auVar25._10_2_ + sVar14) >> 2;
    uVar22 = (ushort)(auVar25._12_2_ + sVar12) >> 2;
    uVar23 = (ushort)(auVar25._14_2_ + sVar14) >> 2;
    uVar24 = (ushort)(auVar33._0_2_ + sVar12) >> 2;
    uVar26 = (ushort)(auVar33._2_2_ + sVar14) >> 2;
    uVar27 = (ushort)(auVar33._4_2_ + sVar12) >> 2;
    uVar28 = (ushort)(auVar33._6_2_ + sVar14) >> 2;
    uVar29 = (ushort)(auVar33._8_2_ + sVar12) >> 2;
    uVar30 = (ushort)(auVar33._10_2_ + sVar14) >> 2;
    uVar31 = (ushort)(auVar33._12_2_ + sVar12) >> 2;
    uVar32 = (ushort)(auVar33._14_2_ + sVar14) >> 2;
    *pu1_dst = (uVar15 != 0) * (uVar15 < 0x100) * (char)uVar15 - (0xff < uVar15);
    pu1_dst[1] = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17);
    pu1_dst[2] = (uVar18 != 0) * (uVar18 < 0x100) * (char)uVar18 - (0xff < uVar18);
    pu1_dst[3] = (uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19);
    pu1_dst[4] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
    pu1_dst[5] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
    pu1_dst[6] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
    pu1_dst[7] = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
    pu1_dst[8] = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
    pu1_dst[9] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
    pu1_dst[10] = (uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27);
    pu1_dst[0xb] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
    pu1_dst[0xc] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
    pu1_dst[0xd] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
    pu1_dst[0xe] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
    pu1_dst[0xf] = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
    lVar4 = (long)dst_strd;
    if (1 < nt) {
      auVar11 = pshufb(ZEXT416(uVar10),(undefined1  [16])0x0);
      iVar6 = 1;
      do {
        *(undefined1 (*) [16])(pu1_dst + lVar4) = auVar11;
        *(undefined1 (*) [16])(pu1_dst + lVar4 * 2) = auVar11;
        *(undefined1 (*) [16])(pu1_dst + lVar4 * 3) = auVar11;
        *(undefined1 (*) [16])(pu1_dst + lVar4 * 4) = auVar11;
        *(undefined1 (*) [16])(pu1_dst + lVar4 * 5) = auVar11;
        *(undefined1 (*) [16])(pu1_dst + lVar4 * 6) = auVar11;
        *(undefined1 (*) [16])(pu1_dst + lVar4 * 7) = auVar11;
        *(undefined1 (*) [16])(pu1_dst + lVar4 * 8) = auVar11;
        *(undefined1 (*) [16])(pu1_dst + lVar4 * 9) = auVar11;
        *(undefined1 (*) [16])(pu1_dst + lVar4 * 10) = auVar11;
        *(undefined1 (*) [16])(pu1_dst + lVar4 * 0xb) = auVar11;
        *(undefined1 (*) [16])(pu1_dst + lVar4 * 0xc) = auVar11;
        *(undefined1 (*) [16])(pu1_dst + lVar4 * 0xd) = auVar11;
        *(undefined1 (*) [16])(pu1_dst + lVar4 * 0xe) = auVar11;
        *(undefined1 (*) [16])(pu1_dst + lVar4 * 0xf) = auVar11;
        iVar6 = iVar6 + 8;
      } while (iVar6 < nt);
    }
    *pu1_dst = (UWORD8)((uint)pu1_ref[(long)(int)uVar3 + 1] +
                        uVar10 * 2 + (uint)pu1_ref[(long)(int)uVar3 + -1] + 2 >> 2);
    if (1 < nt) {
      pUVar7 = pu1_dst + lVar4;
      lVar8 = 0;
      do {
        *pUVar7 = (UWORD8)((uint)pu1_ref[lVar8 + (int)(uVar3 - 2)] + uVar10 * 3 + 2 >> 2);
        pUVar7 = pUVar7 + lVar4;
        lVar8 = lVar8 + -1;
      } while (1 - (ulong)(uint)nt != lVar8);
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_dc_ssse3(UWORD8 *pu1_ref,
                                    WORD32 src_strd,
                                    UWORD8 *pu1_dst,
                                    WORD32 dst_strd,
                                    WORD32 nt,
                                    WORD32 mode)
{

    WORD32 acc_dc;
    WORD32 dc_val, two_dc_val, three_dc_val;
    WORD32 row;
    WORD32 log2nt = 5;
    WORD32 two_nt, three_nt;
    __m128i src_temp1, src_temp7, src_temp3, src_temp4, src_temp5, src_temp6;
    __m128i src_temp8, src_temp10, src_temp2;
    __m128i m_zero = _mm_setzero_si128();
    __m128i sm = _mm_load_si128((__m128i *)&IHEVCE_SHUFFLEMASK5[0]);
    UNUSED(src_strd);
    UNUSED(mode);


    switch(nt)
    {
        case 32:
            log2nt = 5;
            break;
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }
    two_nt = 2 * nt;
    three_nt = 3 * nt;

    acc_dc = 0;
    /* Calculate DC value for the transform block */



    if(nt == 32)
    {
        __m128i temp;
        WORD32 itr_count;

        src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));
        src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 16));
        src_temp7 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 32));
        src_temp8 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 48));

        src_temp3 = _mm_sad_epu8(src_temp3, m_zero);
        src_temp4 = _mm_sad_epu8(src_temp4, m_zero);
        src_temp7 = _mm_sad_epu8(src_temp7, m_zero);
        src_temp8 = _mm_sad_epu8(src_temp8, m_zero);

        src_temp4 = _mm_add_epi16(src_temp3, src_temp4);
        src_temp8 = _mm_add_epi16(src_temp7, src_temp8);
        src_temp4 = _mm_add_epi16(src_temp4, src_temp8);

        src_temp4 = _mm_shuffle_epi8(src_temp4, sm);
        src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

        acc_dc = _mm_cvtsi128_si32(src_temp4);

        acc_dc += pu1_ref[three_nt];
        acc_dc -= pu1_ref[two_nt];

        /* computing acc_dc value */
        dc_val = (acc_dc + nt) >> (log2nt + 1);

        two_dc_val = 2 * dc_val;
        three_dc_val = 3 * dc_val;

        temp = _mm_set1_epi8(dc_val);

        for(itr_count = 0; itr_count < 2; itr_count++)
        {
            /*  pu1_dst[(row * dst_strd) + col] = dc_val;*/
            _mm_storeu_si128((__m128i *)(pu1_dst + ((0) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((1) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((2) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((3) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((4) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((5) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((6) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((7) * dst_strd)), temp);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((8) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((9) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((10) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((11) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((12) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((13) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((14) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((15) * dst_strd)), temp);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((0) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((1) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((2) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((3) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((4) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((5) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((6) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((7) * dst_strd)), temp);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((8) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((9) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((10) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((11) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((12) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((13) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((14) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((15) * dst_strd)), temp);

            pu1_dst += 16 * dst_strd;
        }
    }
    else

    {
        __m128i sm1 = _mm_load_si128((__m128i *)&IHEVCE_SHUFFLEMASK4[0]);

        /* DC filtering for the first top row and first left column */



        if(nt == 4) /* nt multiple of 4*/
        {
            WORD32 temp1, temp2, temp3;

            src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));
            src_temp2 =  _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));

            src_temp4 =  _mm_unpacklo_epi8(src_temp3, m_zero);
            src_temp2 =  _mm_unpacklo_epi8(src_temp2, m_zero);

            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

            acc_dc = _mm_cvtsi128_si32(src_temp4);
            acc_dc += pu1_ref[three_nt];
            acc_dc -= pu1_ref[two_nt];

/* computing acc_dc value */

            dc_val = (acc_dc + nt) >> (log2nt + 1);

            three_dc_val = 3 * dc_val;

            /* loding 8-bit 16 pixel */
            src_temp1 = _mm_set1_epi16(three_dc_val + 2);
            two_dc_val = 2 * dc_val;

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2 */
            src_temp2 = _mm_add_epi16(src_temp2, src_temp1);

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2) >> 2 */
            src_temp2 = _mm_srli_epi16(src_temp2, 2);

            src_temp2 = _mm_packus_epi16(src_temp2, m_zero);

            temp1 = _mm_cvtsi128_si32(src_temp2);

            *(WORD32 *)(&pu1_dst[0]) = temp1;

            src_temp2 = _mm_insert_epi16(src_temp2, dc_val, 0);

            src_temp2 =  _mm_shuffle_epi8(src_temp2, sm1);
            src_temp3 =  _mm_shuffle_epi8(src_temp2, sm1);
            src_temp4 =  _mm_shuffle_epi8(src_temp2, sm1);

            temp1 = _mm_cvtsi128_si32(src_temp2);
            temp2 = _mm_cvtsi128_si32(src_temp3);
            temp3 = _mm_cvtsi128_si32(src_temp4);

            *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp2;
            *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp3;

            /*  retore  first value*/
            pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                            >> 2);

            for(row = 1; row < nt; row++)
                pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                                >> 2;

        }
        else if(nt == 8) /* if nt%8==0*/
        {

            src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));

            src_temp4 = _mm_sad_epu8(src_temp3, m_zero);
            src_temp4 = _mm_shuffle_epi8(src_temp4, sm);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

            acc_dc = _mm_cvtsi128_si32(src_temp4);

            acc_dc += pu1_ref[three_nt];
            acc_dc -= pu1_ref[two_nt];

            /* computing acc_dc value */

            dc_val = (acc_dc + nt) >> (log2nt + 1);

            three_dc_val = 3 * dc_val;
            src_temp1 = _mm_set1_epi16(three_dc_val + 2);
            two_dc_val = 2 * dc_val;

            /* loding 8-bit 16 pixel */
            src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp2 =  _mm_unpacklo_epi8(src_temp2, m_zero);

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2 */
            src_temp2 = _mm_add_epi16(src_temp2, src_temp1);

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2)>>2 */
            src_temp2 = _mm_srli_epi16(src_temp2, 2);
            src_temp2 = _mm_packus_epi16(src_temp2, m_zero);

            _mm_storel_epi64((__m128i *)(pu1_dst), src_temp2);

            /* Fill the remaining rows with DC value*/

            src_temp1 = _mm_set1_epi8(dc_val);
            src_temp2 = _mm_set1_epi8(dc_val);
            src_temp3 = _mm_set1_epi8(dc_val);
            src_temp4 = _mm_set1_epi8(dc_val);
            src_temp5 = _mm_set1_epi8(dc_val);
            src_temp6 = _mm_set1_epi8(dc_val);
            src_temp7 = _mm_set1_epi8(dc_val);

            _mm_storel_epi64((__m128i *)(pu1_dst + ((1) * dst_strd)), src_temp1);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((2) * dst_strd)), src_temp2);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((3) * dst_strd)), src_temp3);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((4) * dst_strd)), src_temp4);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((5) * dst_strd)), src_temp5);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((6) * dst_strd)), src_temp6);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((7) * dst_strd)), src_temp7);

            /*  retore  first value*/
            pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                            >> 2);

            for(row = 1; row < nt; row++)
                pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                                >> 2;

        }
        else /* if nt == 16*/
        {

            src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));
            src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 16));

            src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp10 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 8));

            src_temp3 = _mm_sad_epu8(src_temp3, m_zero);
            src_temp4 = _mm_sad_epu8(src_temp4, m_zero);

            src_temp2  =  _mm_unpacklo_epi8(src_temp2, m_zero);
            src_temp10 =  _mm_unpacklo_epi8(src_temp10, m_zero);

            src_temp4 = _mm_add_epi16(src_temp3, src_temp4);
            src_temp4 = _mm_shuffle_epi8(src_temp4, sm);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

            acc_dc = _mm_cvtsi128_si32(src_temp4);

            acc_dc += pu1_ref[three_nt];
            acc_dc -= pu1_ref[two_nt];

            /* computing acc_dc value */

            dc_val = (acc_dc + nt) >> (log2nt + 1);

            three_dc_val = 3 * dc_val;
            src_temp1 = _mm_set1_epi16(three_dc_val + 2);
            two_dc_val = 2 * dc_val;

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2 */
            src_temp2 = _mm_add_epi16(src_temp2, src_temp1);
            src_temp10 = _mm_add_epi16(src_temp10, src_temp1);
            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2)>>2 */
            src_temp2 = _mm_srli_epi16(src_temp2, 2);
            src_temp10 = _mm_srli_epi16(src_temp10, 2);

            src_temp2 = _mm_packus_epi16(src_temp2, src_temp10);

            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp2);

            /* Fill the remaining rows with DC value*/
            src_temp1 =  _mm_set1_epi8(dc_val);
            src_temp2 =  _mm_set1_epi8(dc_val);
            src_temp3 =  _mm_set1_epi8(dc_val);
            src_temp4 =  _mm_set1_epi8(dc_val);
            src_temp5 =  _mm_set1_epi8(dc_val);
            src_temp6 =  _mm_set1_epi8(dc_val);
            src_temp7 =  _mm_set1_epi8(dc_val);

            for(row = 1; row < nt; row += 8)
            {

                _mm_storeu_si128((__m128i *)(pu1_dst + ((1) * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((2) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((3) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((4) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((5) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((6) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((7) * dst_strd)), src_temp7);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((8) * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((9) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((10) * dst_strd)), src_temp3);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((11) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((12) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((13) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((14) * dst_strd)), src_temp7);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((15) * dst_strd)), src_temp1);

            }

            /*  retore  first value*/
            pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                            >> 2);

            for(row = 1; row < nt; row++)
                pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                                >> 2;

        }
    }
}